

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O0

void mzd_mul_v_s128_128_640(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 (*pauVar7) [16];
  long lVar8;
  ulong *puVar9;
  long in_RDX;
  word *in_RSI;
  ulong *in_RDI;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  block_t *cblock3;
  block_t *cblock2;
  block_t *cblock1;
  word128 mask;
  uint i;
  word idx;
  uint w;
  word128 cval [5];
  block_t *Ablock;
  word *vptr;
  uint i_2;
  uint i_1;
  int local_2fc;
  word local_2f8;
  int local_2ec;
  ulong local_2e8 [11];
  long local_290;
  word *local_288;
  ulong *local_270;
  undefined1 (*local_1d0) [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  ulong local_178;
  ulong uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  ulong local_158;
  ulong uStack_150;
  undefined1 local_148 [16];
  ulong local_138;
  ulong uStack_130;
  uint local_120;
  undefined4 local_11c;
  ulong local_118;
  ulong uStack_110;
  long local_100;
  ulong *local_f8;
  undefined1 (*local_f0) [16];
  undefined1 local_e8 [16];
  ulong local_d8;
  ulong uStack_d0;
  uint local_c0;
  undefined4 local_bc;
  ulong local_b8;
  ulong uStack_b0;
  long local_a0;
  ulong *local_98;
  undefined1 (*local_90) [16];
  undefined1 local_88 [16];
  ulong local_78;
  ulong uStack_70;
  ulong local_68;
  ulong uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  ulong local_48;
  ulong uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  ulong local_28;
  ulong uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_188 = (undefined1  [16])0x0;
  local_2e8[0] = 0;
  local_2e8[1] = 0;
  local_198 = (undefined1  [16])0x0;
  local_2e8[2] = 0;
  local_2e8[3] = 0;
  local_1a8 = (undefined1  [16])0x0;
  local_2e8[4] = 0;
  local_2e8[5] = 0;
  local_1b8 = (undefined1  [16])0x0;
  local_2e8[6] = 0;
  local_2e8[7] = 0;
  local_1c8 = (undefined1  [16])0x0;
  local_1c8._0_8_ = 0;
  local_1c8._8_8_ = 0;
  local_2e8[8] = 0;
  local_2e8[9] = 0;
  uVar10 = local_1c8._0_8_;
  uVar12 = local_1c8._8_8_;
  local_290 = in_RDX;
  local_288 = in_RSI;
  local_270 = in_RDI;
  for (local_2ec = 2; local_2ec != 0; local_2ec = local_2ec + -1) {
    local_2f8 = *local_288;
    for (local_2fc = 0x40; local_2fc != 0; local_2fc = local_2fc + -1) {
      uVar11 = uVar10;
      uVar13 = uVar12;
      mm128_compute_mask(local_2f8,0);
      lVar1 = local_290;
      local_bc = 2;
      for (local_c0 = 0; local_c0 != 2; local_c0 = local_c0 + 1) {
        uVar10 = local_2e8[(ulong)local_c0 * 2];
        uVar12 = local_2e8[(ulong)local_c0 * 2 + 1];
        pauVar7 = (undefined1 (*) [16])(local_290 + (ulong)local_c0 * 0x10);
        uVar3 = *(undefined8 *)*pauVar7;
        uVar4 = *(undefined8 *)(*pauVar7 + 8);
        auVar5._8_8_ = uVar13;
        auVar5._0_8_ = uVar11;
        auVar2 = vpand_avx(*pauVar7,auVar5);
        local_88._0_8_ = auVar2._0_8_;
        local_88._8_8_ = auVar2._8_8_;
        local_2e8[(ulong)local_c0 * 2] = uVar10 ^ local_88._0_8_;
        local_2e8[(ulong)local_c0 * 2 + 1] = uVar12 ^ local_88._8_8_;
        local_90 = pauVar7;
        local_88 = auVar2;
        local_78 = uVar10;
        uStack_70 = uVar12;
        local_68 = uVar11;
        uStack_60 = uVar13;
        local_58 = uVar3;
        uStack_50 = uVar4;
      }
      puVar9 = local_2e8 + 4;
      lVar8 = local_290 + 0x20;
      local_11c = 2;
      for (local_120 = 0; local_120 != 2; local_120 = local_120 + 1) {
        uVar10 = puVar9[(ulong)local_120 * 2];
        uVar12 = local_2e8[(ulong)local_120 * 2 + 5];
        pauVar7 = (undefined1 (*) [16])(lVar8 + (ulong)local_120 * 0x10);
        uVar3 = *(undefined8 *)*pauVar7;
        uVar4 = *(undefined8 *)(*pauVar7 + 8);
        auVar6._8_8_ = uVar13;
        auVar6._0_8_ = uVar11;
        auVar2 = vpand_avx(*pauVar7,auVar6);
        local_e8._0_8_ = auVar2._0_8_;
        local_e8._8_8_ = auVar2._8_8_;
        puVar9[(ulong)local_120 * 2] = uVar10 ^ local_e8._0_8_;
        local_2e8[(ulong)local_120 * 2 + 5] = uVar12 ^ local_e8._8_8_;
        local_f0 = pauVar7;
        local_e8 = auVar2;
        local_d8 = uVar10;
        uStack_d0 = uVar12;
        local_48 = uVar11;
        uStack_40 = uVar13;
        local_38 = uVar3;
        uStack_30 = uVar4;
      }
      local_158 = local_2e8[8];
      uStack_150 = local_2e8[9];
      local_1d0 = (undefined1 (*) [16])(local_290 + 0x40);
      local_168 = *(undefined8 *)*local_1d0;
      uStack_160 = *(undefined8 *)(local_290 + 0x48);
      local_138 = local_2e8[8];
      uStack_130 = local_2e8[9];
      auVar2._8_8_ = uVar13;
      auVar2._0_8_ = uVar11;
      local_148 = vpand_avx(*local_1d0,auVar2);
      uVar10 = local_2e8[8] ^ local_148._0_8_;
      uVar12 = local_2e8[9] ^ local_148._8_8_;
      local_2f8 = local_2f8 >> 1;
      local_290 = local_290 + 0x60;
      local_2e8[8] = uVar10;
      local_2e8[9] = uVar12;
      local_178 = uVar11;
      uStack_170 = uVar13;
      local_118 = uVar11;
      uStack_110 = uVar13;
      local_100 = lVar8;
      local_f8 = puVar9;
      local_b8 = uVar11;
      uStack_b0 = uVar13;
      local_a0 = lVar1;
      local_98 = local_2e8;
      local_28 = uVar11;
      uStack_20 = uVar13;
      local_18 = local_168;
      uStack_10 = uStack_160;
    }
    local_288 = local_288 + 1;
  }
  *local_270 = local_2e8[0];
  local_270[1] = local_2e8[1];
  local_270[2] = local_2e8[2];
  local_270[3] = local_2e8[3];
  local_270[4] = local_2e8[4];
  local_270[5] = local_2e8[5];
  local_270[6] = local_2e8[6];
  local_270[7] = local_2e8[7];
  local_270[8] = local_2e8[8];
  local_270[9] = local_2e8[9];
  return;
}

Assistant:

ATTR_TARGET_S128
void mzd_mul_v_s128_128_640(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word128 cval[5] = {mm128_zero, mm128_zero, mm128_zero, mm128_zero, mm128_zero};
  for (unsigned int w = 2; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 1, idx >>= 1, Ablock += 3) {
      const word128 mask = mm128_compute_mask(idx, 0);
      mm128_xor_mask_region(&cval[0], Ablock[0].w64, mask, 2);
      mm128_xor_mask_region(&cval[2], Ablock[1].w64, mask, 2);
      cval[4] = mm128_xor_mask(cval[4], mm128_load(Ablock[2].w64), mask);
    }
  }

  block_t* cblock1 = BLOCK(c, 0);
  block_t* cblock2 = BLOCK(c, 1);
  block_t* cblock3 = BLOCK(c, 2);
  mm128_store(&cblock1->w64[0], cval[0]);
  mm128_store(&cblock1->w64[2], cval[1]);
  mm128_store(&cblock2->w64[0], cval[2]);
  mm128_store(&cblock2->w64[2], cval[3]);
  mm128_store(&cblock3->w64[0], cval[4]);
}